

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

int __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::init(basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  uint8_t insert_key_byte;
  olc_node_header *ptr_;
  uint uVar1;
  int extraout_EAX;
  ulong uVar2;
  uintptr_t uVar3;
  long in_RCX;
  basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *in_RDX;
  uint in_R8D;
  ulong uVar4;
  undefined1 local_40 [8];
  db_inode_reclaimable_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  
  insert_key_byte = *(uint8_t *)(*(long *)(in_RCX + 8) + 0x20 + (ulong)in_R8D);
  local_40 = (undefined1  [8])ctx;
  uVar1 = basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::get_insert_pos(in_RDX,insert_key_byte,0xf);
  uVar4 = (ulong)uVar1;
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    *(undefined1 *)((long)((this->children)._M_elems + -2) + uVar2) =
         *(undefined1 *)((long)(in_RDX->children)._M_elems + (uVar2 - 4));
    (this->children)._M_elems[uVar2].value._M_i.tagged_ptr =
         (in_RDX->children)._M_elems[uVar2].value._M_i.tagged_ptr;
  }
  if (uVar1 < 0x10) {
    *(uint8_t *)((long)((this->children)._M_elems + -2) + uVar4) = insert_key_byte;
    ptr_ = *(olc_node_header **)(in_RCX + 8);
    *(undefined8 *)(in_RCX + 8) = 0;
    uVar3 = basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(ptr_,LEAF);
    (this->children)._M_elems[uVar4].value._M_i.tagged_ptr = uVar3;
    for (; uVar4 < 4; uVar4 = uVar4 + 1) {
      *(undefined1 *)((long)(this->children)._M_elems + (uVar4 - 0xf)) =
           *(undefined1 *)((long)(in_RDX->children)._M_elems + (uVar4 - 4));
      (this->children)._M_elems[uVar4 + 1].value._M_i.tagged_ptr =
           (in_RDX->children)._M_elems[uVar4].value._M_i.tagged_ptr;
    }
    std::
    unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_40);
    return extraout_EAX;
  }
  __assert_fail("i < parent_class::capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x6f6,
                "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::init(db_type &, inode4_type &, db_leaf_unique_ptr, tree_depth_type) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

constexpr void init(db_type &db_instance, inode4_type &source_node,
                      db_leaf_unique_ptr child,
                      tree_depth_type depth) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode4_type>(
            &source_node, db_instance)};
    const auto key_byte =
        static_cast<std::uint8_t>(child->get_key_view()[depth]);

#ifdef UNODB_DETAIL_X86_64
    const auto insert_pos_index = source_node.get_insert_pos(key_byte, 0xFU);
#else
    const auto keys_integer = source_node.keys.integer.load();
    const auto first_lt = ((keys_integer & 0xFFU) < key_byte) ? 1 : 0;
    const auto second_lt = (((keys_integer >> 8U) & 0xFFU) < key_byte) ? 1 : 0;
    const auto third_lt = (((keys_integer >> 16U) & 0xFFU) < key_byte) ? 1 : 0;
    const auto fourth_lt = (((keys_integer >> 24U) & 0xFFU) < key_byte) ? 1 : 0;
    const auto insert_pos_index =
        static_cast<unsigned>(first_lt + second_lt + third_lt + fourth_lt);
#endif

    unsigned i = 0;
    for (; i < insert_pos_index; ++i) {
      keys.byte_array[i] = source_node.keys.byte_array[i];
      children[i] = source_node.children[i];
    }

    UNODB_DETAIL_ASSUME(i < parent_class::capacity);

    keys.byte_array[i] = static_cast<std::byte>(key_byte);
    children[i] = node_ptr{child.release(), node_type::LEAF};
    ++i;

    for (; i <= inode4_type::capacity; ++i) {
      keys.byte_array[i] = source_node.keys.byte_array[i - 1];
      children[i] = source_node.children[i - 1];
    }
  }